

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O3

size_t jessilib::starts_with_length<char,char16_t>
                 (basic_string_view<char,_std::char_traits<char>_> in_string,
                 basic_string_view<char16_t,_std::char_traits<char16_t>_> in_prefix)

{
  char16_t cVar1;
  char16_t *pcVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char32_t cVar7;
  char *pcVar8;
  jessilib *this;
  decode_result dVar9;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  
  pcVar2 = in_prefix._M_str;
  pcVar4 = (char *)in_prefix._M_len;
  pcVar8 = in_string._M_str;
  this = (jessilib *)in_string._M_len;
  pcVar5 = pcVar4;
  if (pcVar4 == (char *)0x0 || this == (jessilib *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar6 = (char *)0x0;
    do {
      in_string_00._M_str = pcVar4;
      in_string_00._M_len = (size_t)pcVar8;
      dVar9 = decode_codepoint_utf8<char>(this,in_string_00);
      pcVar4 = (char *)dVar9.units;
      cVar1 = *pcVar2;
      cVar7 = (char32_t)(ushort)cVar1;
      lVar3 = 1;
      if (((pcVar5 != (char *)0x1) && ((cVar1 & 0xfc00U) == 0xd800)) &&
         (((ushort)pcVar2[1] & 0xfc00) == 0xdc00)) {
        cVar7 = (uint)(ushort)cVar1 * 0x400 + (uint)(ushort)pcVar2[1] + L'\xfca02400';
        lVar3 = 2;
      }
      if (pcVar4 == (char *)0x0) {
        return (size_t)(char *)0x0;
      }
      if (dVar9.codepoint != cVar7) {
        return (size_t)(char *)0x0;
      }
      pcVar5 = pcVar5 + -lVar3;
      pcVar6 = pcVar6 + (long)pcVar4;
      this = this + -(long)pcVar4;
      if (this == (jessilib *)0x0) break;
      pcVar8 = pcVar8 + (long)pcVar4;
      pcVar2 = pcVar2 + lVar3;
    } while (pcVar5 != (char *)0x0);
  }
  pcVar4 = (char *)0x0;
  if (pcVar5 == (char *)0x0) {
    pcVar4 = pcVar6;
  }
  return (size_t)pcVar4;
}

Assistant:

size_t starts_with_length(std::basic_string_view<LhsCharT> in_string, std::basic_string_view<RhsCharT> in_prefix) {
	// If in_string and in_prefix are the same type, compare their sizes and quickly return if in_string is too small
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (in_string.size() < in_prefix.size()) {
			return 0;
		}
	}

	size_t codepoints_removed{};
	while (!in_string.empty() && !in_prefix.empty()) {
		decode_result string_front = decode_codepoint(in_string);
		decode_result prefix_front = decode_codepoint(in_prefix);

		if (string_front.units == 0
			|| prefix_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return 0;
		}

		if (string_front.codepoint != prefix_front.codepoint) {
			// Codepoints aren't the same
			return 0;
		}

		// Codepoints are equal; trim off the fronts and continue
		in_string.remove_prefix(string_front.units);
		in_prefix.remove_prefix(prefix_front.units);
		codepoints_removed += string_front.units;
	}

	if (!in_prefix.empty()) {
		// We reached end of in_string before end of prefix
		return 0;
	}

	return codepoints_removed;
}